

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O2

int __thiscall Imf_3_4::DeepTiledOutputFile::numXTiles(DeepTiledOutputFile *this,int lx)

{
  ostream *poVar1;
  char *pcVar2;
  LogicExc *this_00;
  stringstream _iex_throw_s;
  ostream local_188 [376];
  
  if ((-1 < lx) && (lx < this->_data->numXLevels)) {
    return this->_data->numXTiles[(uint)lx];
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar1 = std::operator<<(local_188,"Error calling numXTiles() on image file \"");
  pcVar2 = OStream::fileName(this->_data->_streamData->os);
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"\" (Argument is not in valid range).");
  this_00 = (LogicExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::LogicExc::LogicExc(this_00,(stringstream *)&_iex_throw_s);
  __cxa_throw(this_00,&Iex_3_4::LogicExc::typeinfo,Iex_3_4::LogicExc::~LogicExc);
}

Assistant:

int
DeepTiledOutputFile::numXTiles (int lx) const
{
    if (lx < 0 || lx >= _data->numXLevels)
        THROW (
            IEX_NAMESPACE::LogicExc,
            "Error calling numXTiles() on image "
            "file \""
                << _data->_streamData->os->fileName ()
                << "\" "
                   "(Argument is not in valid range).");

    return _data->numXTiles[lx];
}